

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_diag_sse2_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ushort uVar1;
  int *piVar6;
  int *piVar7;
  short sVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 uVar17;
  undefined4 uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  parasail_result_t *ppVar22;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  long lVar23;
  ulong uVar24;
  char *pcVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  undefined8 unaff_RBX;
  uint uVar29;
  char *__format;
  int iVar31;
  int16_t iVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  long lVar38;
  uint uVar39;
  short sVar40;
  uint uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  short sVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ushort uVar58;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  undefined1 auVar59 [16];
  undefined1 auVar67 [16];
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 local_248 [16];
  int16_t *local_238;
  short local_208;
  short sStack_206;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  long local_1d0;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  long local_140;
  long local_138;
  ulong local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  int *local_f0;
  int *local_e8;
  int *local_e0;
  int *local_d8;
  int *local_d0;
  int *local_c8;
  int *local_c0;
  int *local_b8;
  ulong local_b0;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar30;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar25 = "_s2";
  }
  else if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar25 = "s2Len";
  }
  else if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar25 = "open";
  }
  else if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar25 = "gap";
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar25 = "matrix";
  }
  else {
    if (matrix->type != 0) {
      uVar24 = (ulong)(uint)matrix->length;
LAB_0055bb13:
      local_178._8_8_ = local_178._0_8_;
      local_178._0_8_ = _s1;
      iVar21 = matrix->min;
      iVar30 = -iVar21;
      if (iVar21 != -open && SBORROW4(iVar21,-open) == iVar21 + open < 0) {
        iVar30 = open;
      }
      uVar29 = iVar30 - 0x7fff;
      iVar21 = matrix->max;
      auVar42 = pshuflw(ZEXT416(uVar29),ZEXT416(uVar29),0);
      uVar41 = auVar42._0_4_;
      local_158._4_4_ = uVar41;
      local_158._0_4_ = uVar41;
      local_158._8_4_ = uVar41;
      local_158._12_4_ = uVar41;
      local_208 = auVar42._0_2_;
      sStack_206 = auVar42._2_2_;
      local_1a8._4_4_ = uVar41;
      local_1a8._0_4_ = uVar41;
      local_1a8._8_4_ = uVar41;
      local_1a8._12_4_ = uVar41;
      uVar19 = (uint)uVar24;
      ppVar22 = parasail_result_new_table1(uVar19,s2Len);
      if (ppVar22 != (parasail_result_t *)0x0) {
        ppVar22->flag = ppVar22->flag | 0x8221004;
        uVar28 = (ulong)(s2Len + 0xe);
        ptr = parasail_memalign_int16_t(0x10,uVar28);
        ptr_00 = parasail_memalign_int16_t(0x10,uVar28);
        ptr_01 = parasail_memalign_int16_t(0x10,uVar28);
        if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
          lVar38 = (long)(int)uVar19;
          if (matrix->type == 0) {
            local_238 = parasail_memalign_int16_t(0x10,(long)(int)(uVar19 + 7));
            uVar28 = 0;
            if (local_238 == (int16_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar37 = 0;
            if (0 < (int)uVar19) {
              uVar37 = uVar24;
            }
            for (; lVar23 = lVar38, uVar37 != uVar28; uVar28 = uVar28 + 1) {
              local_238[uVar28] = (int16_t)matrix->mapper[*(byte *)(local_178._0_8_ + uVar28)];
            }
            for (; lVar23 < (int)(uVar19 + 7); lVar23 = lVar23 + 1) {
              local_238[lVar23] = 0;
            }
          }
          else {
            local_238 = (int16_t *)0x0;
          }
          uVar34 = s2Len + 7;
          auVar42 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_RBX >> 0x10),0x7ffe - (short)iVar21))
          ;
          auVar42 = pshuflw(auVar42,auVar42,0);
          local_a8 = auVar42._0_2_;
          sStack_a6 = auVar42._2_2_;
          local_88 = uVar41;
          uStack_84 = uVar41;
          uStack_80 = uVar41;
          uStack_7c = uVar41 & 0xffff;
          auVar43 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
          local_58 = auVar43._0_4_;
          uStack_54 = local_58;
          uStack_50 = local_58;
          uStack_4c = local_58;
          auVar43 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
          local_68 = auVar43._0_4_;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          auVar43 = pshuflw(ZEXT416(uVar19),ZEXT416(uVar19),0);
          local_98 = auVar43._0_4_;
          uVar17 = local_98;
          uStack_94 = local_98;
          uStack_90 = local_98;
          uStack_8c = local_98;
          auVar44 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
          local_78 = auVar44._0_4_;
          uVar18 = local_78;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uVar24 = (ulong)(uint)s2Len;
          piVar6 = matrix->mapper;
          for (uVar28 = 0; uVar24 != uVar28; uVar28 = uVar28 + 1) {
            ptr[uVar28 + 7] = (int16_t)piVar6[(byte)_s2[uVar28]];
          }
          for (lVar23 = 0; uVar28 = uVar24, lVar23 != 7; lVar23 = lVar23 + 1) {
            ptr[lVar23] = 0;
          }
          for (; (int)uVar28 < (int)uVar34; uVar28 = uVar28 + 1) {
            ptr[uVar28 + 7] = 0;
          }
          for (uVar28 = 0; iVar32 = (int16_t)uVar29, uVar24 != uVar28; uVar28 = uVar28 + 1) {
            ptr_00[uVar28 + 7] = 0;
            ptr_01[uVar28 + 7] = iVar32;
          }
          for (lVar23 = 0; uVar28 = uVar24, lVar23 != 7; lVar23 = lVar23 + 1) {
            ptr_00[lVar23] = iVar32;
            ptr_01[lVar23] = iVar32;
          }
          for (; (int)uVar28 < (int)uVar34; uVar28 = uVar28 + 1) {
            ptr_00[uVar28 + 7] = iVar32;
            ptr_01[uVar28 + 7] = iVar32;
          }
          uVar19 = uVar19 - 1;
          local_1d0 = 0;
          local_b0 = (ulong)uVar34;
          if ((int)uVar34 < 1) {
            local_b0 = 0;
          }
          local_138 = uVar24 * 4;
          local_140 = uVar24 * 0x20;
          local_248._8_8_ = 0x100020003;
          local_248._0_8_ = 0x4000500060007;
          auVar75._4_2_ = local_208;
          auVar75._0_4_ = uVar41;
          auVar75._6_2_ = sStack_206;
          auVar75._8_2_ = local_208;
          auVar75._10_2_ = sStack_206;
          auVar75._12_2_ = local_208;
          auVar75._14_2_ = sStack_206;
          local_188 = auVar75;
          local_198 = CONCAT26(sStack_a6,CONCAT24(local_a8,auVar42._0_4_));
          uStack_190 = CONCAT26(sStack_a6,CONCAT24(local_a8,auVar42._0_4_));
          auVar42._4_4_ = local_58;
          auVar42._0_4_ = local_58;
          auVar42._8_4_ = local_58;
          auVar42._12_4_ = local_58;
          local_168 = auVar75;
          auVar59 = auVar75;
          for (uVar28 = 0; (long)uVar28 < lVar38; uVar28 = uVar28 + 8) {
            local_130 = uVar28;
            if (matrix->type == 0) {
              uVar34 = (uint)local_238[uVar28];
              uVar20 = (uint)local_238[uVar28 + 1];
              uVar26 = (uint)local_238[uVar28 + 2];
              uVar35 = (uint)local_238[uVar28 + 3];
              uVar33 = (uint)local_238[uVar28 + 4];
              uVar27 = (uint)local_238[uVar28 + 5];
              uVar39 = (uint)local_238[uVar28 + 6];
              uVar36 = (int)local_238[uVar28 + 7];
            }
            else {
              uVar34 = (uint)uVar28;
              uVar20 = uVar19;
              if ((long)(uVar28 | 1) < lVar38) {
                uVar20 = uVar34 | 1;
              }
              uVar26 = uVar34 | 2;
              if (lVar38 <= (long)(uVar28 | 2)) {
                uVar26 = uVar19;
              }
              uVar35 = uVar34 | 3;
              if (lVar38 <= (long)(uVar28 | 3)) {
                uVar35 = uVar19;
              }
              uVar33 = uVar34 | 4;
              if (lVar38 <= (long)(uVar28 | 4)) {
                uVar33 = uVar19;
              }
              uVar27 = uVar34 | 5;
              if (lVar38 <= (long)(uVar28 | 5)) {
                uVar27 = uVar19;
              }
              uVar39 = uVar34 | 6;
              if (lVar38 <= (long)(uVar28 | 6)) {
                uVar39 = uVar19;
              }
              uVar36 = uVar34 | 7;
              if (lVar38 <= (long)(uVar28 | 7)) {
                uVar36 = uVar19;
              }
            }
            local_1d8 = uVar28 | 1;
            local_1e0 = uVar28 | 2;
            local_1e8 = uVar28 | 3;
            local_1f0 = uVar28 | 4;
            local_1f8 = uVar28 | 5;
            piVar6 = matrix->matrix;
            iVar21 = matrix->size;
            local_b8 = piVar6 + (int)(uVar27 * iVar21);
            local_c0 = piVar6 + (int)(uVar35 * iVar21);
            local_c8 = piVar6 + (int)(uVar20 * iVar21);
            local_d0 = piVar6 + (int)(uVar34 * iVar21);
            local_d8 = piVar6 + (int)(uVar26 * iVar21);
            local_e0 = piVar6 + (int)(uVar33 * iVar21);
            local_e8 = piVar6 + (int)(uVar39 * iVar21);
            local_f0 = piVar6 + (int)(uVar36 * iVar21);
            local_f8 = local_138 * (uVar28 | 7);
            local_108 = local_138 * local_1e0 + -8;
            local_110 = local_138 * local_1e8 + -0xc;
            local_118 = local_138 * local_1f0 + -0x10;
            local_120 = local_138 * local_1f8 + -0x14;
            local_128 = local_138 * (uVar28 | 6) + -0x18;
            local_100 = local_138 * local_1d8 + -4;
            local_98._0_2_ = auVar43._0_2_;
            local_98._2_2_ = auVar43._2_2_;
            local_48 = -(ushort)((short)local_248._0_2_ < (short)local_98);
            sStack_46 = -(ushort)((short)local_248._2_2_ < local_98._2_2_);
            sStack_44 = -(ushort)((short)local_248._4_2_ < (short)local_98);
            sStack_42 = -(ushort)((short)local_248._6_2_ < local_98._2_2_);
            sStack_40 = -(ushort)((short)local_248._8_2_ < (short)local_98);
            sStack_3e = -(ushort)((short)local_248._10_2_ < local_98._2_2_);
            sStack_3c = -(ushort)((short)local_248._12_2_ < (short)local_98);
            sStack_3a = -(ushort)((short)local_248._14_2_ < local_98._2_2_);
            auVar55._4_4_ = uVar41;
            auVar55._0_4_ = uVar41;
            auVar55._8_4_ = uVar41;
            auVar55._12_4_ = uVar41 & 0xffff;
            auVar45._4_2_ = local_208;
            auVar45._0_4_ = uVar41;
            auVar45._6_2_ = sStack_206;
            auVar45._8_2_ = local_208;
            auVar45._10_2_ = sStack_206;
            auVar45._12_2_ = local_208;
            auVar45._14_2_ = sStack_206;
            auVar47 = _DAT_008a1b90;
            auVar67 = auVar45;
            auVar54 = auVar55;
            for (uVar37 = 0; local_b0 != uVar37; uVar37 = uVar37 + 1) {
              local_178 = auVar59;
              auVar57._0_8_ = auVar55._2_8_;
              auVar57._8_8_ = auVar55._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar37 + 7] << 0x30;
              auVar51._0_8_ = auVar67._2_8_;
              auVar51._8_8_ = auVar67._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar37 + 7] << 0x30;
              auVar56 = psubsw(auVar57,auVar42);
              auVar67._4_4_ = local_68;
              auVar67._0_4_ = local_68;
              auVar67._8_4_ = local_68;
              auVar67._12_4_ = local_68;
              auVar52 = psubsw(auVar51,auVar67);
              sVar8 = auVar56._0_2_;
              sVar40 = auVar52._0_2_;
              auVar53._0_2_ = (ushort)(sVar40 < sVar8) * sVar8 | (ushort)(sVar40 >= sVar8) * sVar40;
              sVar8 = auVar56._2_2_;
              sVar40 = auVar52._2_2_;
              auVar53._2_2_ = (ushort)(sVar40 < sVar8) * sVar8 | (ushort)(sVar40 >= sVar8) * sVar40;
              sVar8 = auVar56._4_2_;
              sVar40 = auVar52._4_2_;
              auVar53._4_2_ = (ushort)(sVar40 < sVar8) * sVar8 | (ushort)(sVar40 >= sVar8) * sVar40;
              sVar8 = auVar56._6_2_;
              sVar40 = auVar52._6_2_;
              auVar53._6_2_ = (ushort)(sVar40 < sVar8) * sVar8 | (ushort)(sVar40 >= sVar8) * sVar40;
              sVar8 = auVar56._8_2_;
              sVar40 = auVar52._8_2_;
              auVar53._8_2_ = (ushort)(sVar40 < sVar8) * sVar8 | (ushort)(sVar40 >= sVar8) * sVar40;
              sVar8 = auVar56._10_2_;
              sVar40 = auVar52._10_2_;
              auVar53._10_2_ = (ushort)(sVar40 < sVar8) * sVar8 | (ushort)(sVar40 >= sVar8) * sVar40
              ;
              sVar8 = auVar56._12_2_;
              sVar40 = auVar52._12_2_;
              sVar46 = auVar52._14_2_;
              auVar53._12_2_ = (ushort)(sVar40 < sVar8) * sVar8 | (ushort)(sVar40 >= sVar8) * sVar40
              ;
              sVar8 = auVar56._14_2_;
              auVar53._14_2_ = (ushort)(sVar46 < sVar8) * sVar8 | (ushort)(sVar46 >= sVar8) * sVar46
              ;
              auVar55 = psubsw(auVar55,auVar42);
              auVar45 = psubsw(auVar45,auVar67);
              sVar8 = auVar55._0_2_;
              sVar40 = auVar45._0_2_;
              auVar52._0_2_ = (ushort)(sVar40 < sVar8) * sVar8 | (ushort)(sVar40 >= sVar8) * sVar40;
              sVar8 = auVar55._2_2_;
              sVar40 = auVar45._2_2_;
              auVar52._2_2_ = (ushort)(sVar40 < sVar8) * sVar8 | (ushort)(sVar40 >= sVar8) * sVar40;
              sVar8 = auVar55._4_2_;
              sVar40 = auVar45._4_2_;
              auVar52._4_2_ = (ushort)(sVar40 < sVar8) * sVar8 | (ushort)(sVar40 >= sVar8) * sVar40;
              sVar8 = auVar55._6_2_;
              sVar40 = auVar45._6_2_;
              auVar52._6_2_ = (ushort)(sVar40 < sVar8) * sVar8 | (ushort)(sVar40 >= sVar8) * sVar40;
              sVar8 = auVar55._8_2_;
              sVar40 = auVar45._8_2_;
              auVar52._8_2_ = (ushort)(sVar40 < sVar8) * sVar8 | (ushort)(sVar40 >= sVar8) * sVar40;
              sVar8 = auVar55._10_2_;
              sVar40 = auVar45._10_2_;
              auVar52._10_2_ = (ushort)(sVar40 < sVar8) * sVar8 | (ushort)(sVar40 >= sVar8) * sVar40
              ;
              sVar8 = auVar55._12_2_;
              sVar40 = auVar45._12_2_;
              sVar46 = auVar45._14_2_;
              auVar52._12_2_ = (ushort)(sVar40 < sVar8) * sVar8 | (ushort)(sVar40 >= sVar8) * sVar40
              ;
              sVar8 = auVar55._14_2_;
              auVar52._14_2_ = (ushort)(sVar46 < sVar8) * sVar8 | (ushort)(sVar46 >= sVar8) * sVar46
              ;
              auVar76._14_2_ = (short)(piVar6 + (int)(uVar34 * iVar21))[ptr[uVar37 + 7]];
              auVar76._12_2_ = (short)(piVar6 + (int)(uVar20 * iVar21))[ptr[uVar37 + 6]];
              auVar76._10_2_ = (short)(piVar6 + (int)(uVar26 * iVar21))[ptr[uVar37 + 5]];
              auVar76._8_2_ = (short)(piVar6 + (int)(uVar35 * iVar21))[ptr[uVar37 + 4]];
              auVar76._6_2_ = (short)(piVar6 + (int)(uVar33 * iVar21))[ptr[uVar37 + 3]];
              auVar76._4_2_ = (short)(piVar6 + (int)(uVar27 * iVar21))[ptr[uVar37 + 2]];
              auVar76._0_2_ = (undefined2)(piVar6 + (int)(uVar36 * iVar21))[ptr[uVar37]];
              auVar76._2_2_ = (short)(piVar6 + (int)(uVar39 * iVar21))[ptr[uVar37 + 1]];
              auVar45 = paddsw(auVar54,auVar76);
              uVar58 = ((short)auVar52._0_2_ < (short)auVar53._0_2_) * auVar53._0_2_ |
                       ((short)auVar52._0_2_ >= (short)auVar53._0_2_) * auVar52._0_2_;
              uVar60 = ((short)auVar52._2_2_ < (short)auVar53._2_2_) * auVar53._2_2_ |
                       ((short)auVar52._2_2_ >= (short)auVar53._2_2_) * auVar52._2_2_;
              uVar61 = ((short)auVar52._4_2_ < (short)auVar53._4_2_) * auVar53._4_2_ |
                       ((short)auVar52._4_2_ >= (short)auVar53._4_2_) * auVar52._4_2_;
              uVar62 = ((short)auVar52._6_2_ < (short)auVar53._6_2_) * auVar53._6_2_ |
                       ((short)auVar52._6_2_ >= (short)auVar53._6_2_) * auVar52._6_2_;
              uVar63 = ((short)auVar52._8_2_ < (short)auVar53._8_2_) * auVar53._8_2_ |
                       ((short)auVar52._8_2_ >= (short)auVar53._8_2_) * auVar52._8_2_;
              uVar64 = ((short)auVar52._10_2_ < (short)auVar53._10_2_) * auVar53._10_2_ |
                       ((short)auVar52._10_2_ >= (short)auVar53._10_2_) * auVar52._10_2_;
              uVar65 = ((short)auVar52._12_2_ < (short)auVar53._12_2_) * auVar53._12_2_ |
                       ((short)auVar52._12_2_ >= (short)auVar53._12_2_) * auVar52._12_2_;
              uVar66 = ((short)auVar52._14_2_ < (short)auVar53._14_2_) * auVar53._14_2_ |
                       ((short)auVar52._14_2_ >= (short)auVar53._14_2_) * auVar52._14_2_;
              sVar40 = (-1 < (short)uVar58) * uVar58;
              sVar8 = (-1 < (short)uVar60) * uVar60;
              sVar46 = (-1 < (short)uVar61) * uVar61;
              sVar68 = (-1 < (short)uVar62) * uVar62;
              sVar69 = (-1 < (short)uVar63) * uVar63;
              sVar70 = (-1 < (short)uVar64) * uVar64;
              sVar71 = (-1 < (short)uVar65) * uVar65;
              sVar72 = (-1 < (short)uVar66) * uVar66;
              sVar73 = auVar45._0_2_;
              auVar54._0_2_ =
                   (ushort)(sVar40 < sVar73) * sVar73 | (ushort)(sVar40 >= sVar73) * sVar40;
              sVar40 = auVar45._2_2_;
              auVar54._2_2_ = (ushort)(sVar8 < sVar40) * sVar40 | (ushort)(sVar8 >= sVar40) * sVar8;
              sVar8 = auVar45._4_2_;
              auVar54._4_2_ = (ushort)(sVar46 < sVar8) * sVar8 | (ushort)(sVar46 >= sVar8) * sVar46;
              sVar8 = auVar45._6_2_;
              auVar54._6_2_ = (ushort)(sVar68 < sVar8) * sVar8 | (ushort)(sVar68 >= sVar8) * sVar68;
              sVar8 = auVar45._8_2_;
              auVar54._8_2_ = (ushort)(sVar69 < sVar8) * sVar8 | (ushort)(sVar69 >= sVar8) * sVar69;
              sVar8 = auVar45._10_2_;
              auVar54._10_2_ = (ushort)(sVar70 < sVar8) * sVar8 | (ushort)(sVar70 >= sVar8) * sVar70
              ;
              sVar8 = auVar45._12_2_;
              auVar54._12_2_ = (ushort)(sVar71 < sVar8) * sVar8 | (ushort)(sVar71 >= sVar8) * sVar71
              ;
              sVar8 = auVar45._14_2_;
              auVar54._14_2_ = (ushort)(sVar72 < sVar8) * sVar8 | (ushort)(sVar72 >= sVar8) * sVar72
              ;
              sVar40 = auVar47._0_2_;
              auVar56._0_2_ = -(ushort)(sVar40 == -1);
              sVar46 = auVar47._2_2_;
              auVar56._2_2_ = -(ushort)(sVar46 == -1);
              sVar68 = auVar47._4_2_;
              auVar56._4_2_ = -(ushort)(sVar68 == -1);
              sVar69 = auVar47._6_2_;
              auVar56._6_2_ = -(ushort)(sVar69 == -1);
              sVar70 = auVar47._8_2_;
              auVar56._8_2_ = -(ushort)(sVar70 == -1);
              sVar71 = auVar47._10_2_;
              auVar56._10_2_ = -(ushort)(sVar71 == -1);
              sVar72 = auVar47._12_2_;
              sVar73 = auVar47._14_2_;
              auVar56._12_2_ = -(ushort)(sVar72 == -1);
              auVar56._14_2_ = -(ushort)(sVar73 == -1);
              auVar55 = ~auVar56 & auVar54;
              sVar8 = auVar55._0_2_;
              uVar58 = auVar55._2_2_;
              uVar65 = auVar55._14_2_;
              uVar62 = auVar55._8_2_;
              uVar63 = auVar55._10_2_;
              uVar64 = auVar55._12_2_;
              uVar60 = auVar55._4_2_;
              uVar61 = auVar55._6_2_;
              if (7 < uVar37) {
                bVar9 = sVar8 < (short)local_198;
                uVar1 = (ushort)!bVar9 * (short)local_198;
                bVar10 = (short)uVar58 < local_198._2_2_;
                uVar2 = (ushort)!bVar10 * local_198._2_2_;
                bVar11 = (short)uVar60 < local_198._4_2_;
                uVar3 = (ushort)!bVar11 * local_198._4_2_;
                bVar12 = (short)uVar62 < (short)uStack_190;
                uVar4 = (ushort)!bVar12 * (short)uStack_190;
                bVar13 = (short)uVar63 < uStack_190._2_2_;
                uVar5 = (ushort)!bVar13 * uStack_190._2_2_;
                bVar14 = (short)uVar64 < uStack_190._4_2_;
                uVar66 = (ushort)!bVar14 * uStack_190._4_2_;
                local_198 = CONCAT26(((short)uVar61 < local_198._6_2_) * uVar61 |
                                     (ushort)((short)uVar61 >= local_198._6_2_) * local_198._6_2_,
                                     CONCAT24(bVar11 * uVar60 | uVar3,
                                              CONCAT22(bVar10 * uVar58 | uVar2,
                                                       (ushort)bVar9 * sVar8 | uVar1)));
                uStack_190 = CONCAT26(((short)uVar65 < uStack_190._6_2_) * uVar65 |
                                      (ushort)((short)uVar65 >= uStack_190._6_2_) * uStack_190._6_2_
                                      ,CONCAT24(bVar14 * uVar64 | uVar66,
                                                CONCAT22(bVar13 * uVar63 | uVar5,
                                                         bVar12 * uVar62 | uVar4)));
                local_188._2_2_ =
                     ((short)local_188._2_2_ < (short)uVar58) * uVar58 |
                     (ushort)((short)local_188._2_2_ >= (short)uVar58) * local_188._2_2_;
                local_188._0_2_ =
                     (ushort)((short)local_188._0_2_ < sVar8) * sVar8 |
                     (ushort)((short)local_188._0_2_ >= sVar8) * local_188._0_2_;
                local_188._4_2_ =
                     ((short)local_188._4_2_ < (short)uVar60) * uVar60 |
                     (ushort)((short)local_188._4_2_ >= (short)uVar60) * local_188._4_2_;
                local_188._6_2_ =
                     ((short)local_188._6_2_ < (short)uVar61) * uVar61 |
                     (ushort)((short)local_188._6_2_ >= (short)uVar61) * local_188._6_2_;
                local_188._8_2_ =
                     ((short)local_188._8_2_ < (short)uVar62) * uVar62 |
                     (ushort)((short)local_188._8_2_ >= (short)uVar62) * local_188._8_2_;
                local_188._10_2_ =
                     ((short)local_188._10_2_ < (short)uVar63) * uVar63 |
                     (ushort)((short)local_188._10_2_ >= (short)uVar63) * local_188._10_2_;
                local_188._12_2_ =
                     ((short)local_188._12_2_ < (short)uVar64) * uVar64 |
                     (ushort)((short)local_188._12_2_ >= (short)uVar64) * local_188._12_2_;
                local_188._14_2_ =
                     ((short)local_188._14_2_ < (short)uVar65) * uVar65 |
                     (ushort)((short)local_188._14_2_ >= (short)uVar65) * local_188._14_2_;
              }
              piVar7 = ((ppVar22->field_4).rowcols)->score_row;
              if (uVar37 < uVar24) {
                *(uint *)((long)piVar7 + uVar37 * 4 + local_1d0) = (uint)uVar65;
              }
              if (uVar37 - 1 < uVar24 && (long)local_1d8 < lVar38) {
                *(uint *)((long)piVar7 + uVar37 * 4 + local_100) = (uint)uVar64;
              }
              if (((long)local_1e0 < lVar38) && ((long)(uVar37 - 2) < (long)uVar24 && 1 < uVar37)) {
                *(uint *)((long)piVar7 + uVar37 * 4 + local_108) = (uint)uVar63;
              }
              if (((long)local_1e8 < lVar38) && ((long)(uVar37 - 3) < (long)uVar24 && 2 < uVar37)) {
                *(uint *)((long)piVar7 + uVar37 * 4 + local_110) = (uint)uVar62;
              }
              if (((long)local_1f0 < lVar38) && ((long)(uVar37 - 4) < (long)uVar24 && 3 < uVar37)) {
                *(uint *)((long)piVar7 + uVar37 * 4 + local_118) = (uint)uVar61;
              }
              if (((long)local_1f8 < lVar38) && ((long)(uVar37 - 5) < (long)uVar24 && 4 < uVar37)) {
                *(uint *)((long)piVar7 + uVar37 * 4 + local_120) = (uint)uVar60;
              }
              if (((long)(uVar28 | 6) < lVar38) && ((long)(uVar37 - 6) < (long)uVar24 && 5 < uVar37)
                 ) {
                *(uint *)((long)piVar7 + uVar37 * 4 + local_128) = (uint)uVar58;
              }
              if (6 < uVar37 && (long)(uVar28 | 7) < lVar38) {
                *(uint *)((long)piVar7 + uVar37 * 4 + local_f8 + -0x1c) = auVar55._0_4_ & 0xffff;
              }
              auVar15._4_2_ = local_208;
              auVar15._0_4_ = uVar41;
              auVar15._6_2_ = sStack_206;
              auVar15._8_2_ = local_208;
              auVar15._10_2_ = sStack_206;
              auVar15._12_2_ = local_208;
              auVar15._14_2_ = sStack_206;
              auVar67 = ~auVar56 & auVar53 | auVar15 & auVar56;
              auVar45 = ~auVar56 & auVar52 | auVar15 & auVar56;
              local_78._0_2_ = auVar44._0_2_;
              local_78._2_2_ = auVar44._2_2_;
              auVar48._0_2_ = -(ushort)(sVar40 < (short)local_78);
              auVar48._2_2_ = -(ushort)(sVar46 < local_78._2_2_);
              auVar48._4_2_ = -(ushort)(sVar68 < (short)local_78);
              auVar48._6_2_ = -(ushort)(sVar69 < local_78._2_2_);
              auVar48._8_2_ = -(ushort)(sVar70 < (short)local_78);
              auVar48._10_2_ = -(ushort)(sVar71 < local_78._2_2_);
              auVar48._12_2_ = -(ushort)(sVar72 < (short)local_78);
              auVar48._14_2_ = -(ushort)(sVar73 < local_78._2_2_);
              auVar16._2_2_ = -(ushort)((short)local_248._2_2_ < local_98._2_2_);
              auVar16._0_2_ = -(ushort)((short)local_248._0_2_ < (short)local_98);
              auVar16._4_2_ = -(ushort)((short)local_248._4_2_ < (short)local_98);
              auVar16._6_2_ = -(ushort)((short)local_248._6_2_ < local_98._2_2_);
              auVar16._8_2_ = -(ushort)((short)local_248._8_2_ < (short)local_98);
              auVar16._10_2_ = -(ushort)((short)local_248._10_2_ < local_98._2_2_);
              auVar16._12_2_ = -(ushort)((short)local_248._12_2_ < (short)local_98);
              auVar16._14_2_ = -(ushort)((short)local_248._14_2_ < local_98._2_2_);
              auVar52 = psraw(auVar47,0xf);
              auVar52 = ~auVar52 & auVar48 & auVar16;
              auVar49._0_2_ = -(ushort)(sVar8 == auVar59._0_2_);
              auVar49._2_2_ = -(ushort)(uVar58 == auVar59._2_2_);
              auVar49._4_2_ = -(ushort)(uVar60 == auVar59._4_2_);
              auVar49._6_2_ = -(ushort)(uVar61 == auVar59._6_2_);
              auVar49._8_2_ = -(ushort)(uVar62 == auVar59._8_2_);
              auVar49._10_2_ = -(ushort)(uVar63 == auVar59._10_2_);
              auVar49._12_2_ = -(ushort)(uVar64 == auVar59._12_2_);
              auVar49._14_2_ = -(ushort)(uVar65 == auVar59._14_2_);
              auVar50._0_2_ = -(ushort)(auVar59._0_2_ < sVar8);
              auVar50._2_2_ = -(ushort)((short)auVar59._2_2_ < (short)uVar58);
              auVar50._4_2_ = -(ushort)((short)auVar59._4_2_ < (short)uVar60);
              auVar50._6_2_ = -(ushort)((short)auVar59._6_2_ < (short)uVar61);
              auVar50._8_2_ = -(ushort)((short)auVar59._8_2_ < (short)uVar62);
              auVar50._10_2_ = -(ushort)((short)auVar59._10_2_ < (short)uVar63);
              auVar50._12_2_ = -(ushort)((short)auVar59._12_2_ < (short)uVar64);
              auVar50._14_2_ = -(ushort)((short)auVar59._14_2_ < (short)uVar65);
              auVar74._0_2_ = -(ushort)(sVar40 < auVar75._0_2_);
              auVar74._2_2_ = -(ushort)(sVar46 < auVar75._2_2_);
              auVar74._4_2_ = -(ushort)(sVar68 < auVar75._4_2_);
              auVar74._6_2_ = -(ushort)(sVar69 < auVar75._6_2_);
              auVar74._8_2_ = -(ushort)(sVar70 < auVar75._8_2_);
              auVar74._10_2_ = -(ushort)(sVar71 < auVar75._10_2_);
              auVar74._12_2_ = -(ushort)(sVar72 < auVar75._12_2_);
              auVar74._14_2_ = -(ushort)(sVar73 < auVar75._14_2_);
              auVar74 = auVar74 & auVar49;
              auVar51 = auVar50 & auVar52;
              auVar59 = auVar54 & auVar51 | ~auVar51 & auVar59;
              auVar54 = ~auVar74 & auVar51 | auVar52 & auVar74;
              local_168 = ~auVar54 & local_168 | local_248 & auVar54;
              ptr_00[uVar37] = sVar8;
              ptr_01[uVar37] = auVar67._0_2_;
              auVar52 = (auVar74 | auVar50) & auVar52;
              auVar75 = ~auVar52 & auVar75 | auVar47 & auVar52;
              auVar47 = paddsw(auVar47,_DAT_008a1ba0);
              auVar54 = auVar57;
              local_158 = auVar59;
              local_1a8 = auVar75;
            }
            local_248 = paddsw(local_248,_DAT_008a1bb0);
            local_1d0 = local_1d0 + uVar24 * 0x20;
          }
          iVar30 = 0;
          iVar21 = 0;
          for (lVar38 = 0; uVar58 = (ushort)uVar29, (int)lVar38 != 8; lVar38 = lVar38 + 1) {
            uVar60 = *(ushort *)(local_158 + lVar38 * 2);
            if ((short)uVar58 < (short)uVar60) {
              iVar21 = (int)*(short *)(local_168 + lVar38 * 2);
              iVar30 = (int)*(short *)(local_1a8 + lVar38 * 2);
              uVar29 = (uint)uVar60;
            }
            else if (uVar60 == uVar58) {
              iVar31 = (int)*(short *)(local_1a8 + lVar38 * 2);
              if (iVar31 < iVar30) {
                iVar21 = (int)*(short *)(local_168 + lVar38 * 2);
                iVar30 = iVar31;
              }
              else if ((iVar30 == iVar31) && (*(short *)(local_168 + lVar38 * 2) <= iVar21)) {
                iVar21 = (int)*(short *)(local_168 + lVar38 * 2);
              }
            }
          }
          auVar43._0_2_ = -(ushort)((short)local_198 < local_208);
          auVar43._2_2_ = -(ushort)(local_198._2_2_ < sStack_206);
          auVar43._4_2_ = -(ushort)(local_198._4_2_ < local_208);
          auVar43._6_2_ = -(ushort)(local_198._6_2_ < sStack_206);
          auVar43._8_2_ = -(ushort)((short)uStack_190 < local_208);
          auVar43._10_2_ = -(ushort)(uStack_190._2_2_ < sStack_206);
          auVar43._12_2_ = -(ushort)(uStack_190._4_2_ < local_208);
          auVar43._14_2_ = -(ushort)(uStack_190._6_2_ < sStack_206);
          auVar44._0_2_ = -(ushort)(local_a8 < (short)local_188._0_2_);
          auVar44._2_2_ = -(ushort)(sStack_a6 < (short)local_188._2_2_);
          auVar44._4_2_ = -(ushort)(local_a8 < (short)local_188._4_2_);
          auVar44._6_2_ = -(ushort)(sStack_a6 < (short)local_188._6_2_);
          auVar44._8_2_ = -(ushort)(local_a8 < (short)local_188._8_2_);
          auVar44._10_2_ = -(ushort)(sStack_a6 < (short)local_188._10_2_);
          auVar44._12_2_ = -(ushort)(local_a8 < (short)local_188._12_2_);
          auVar44._14_2_ = -(ushort)(sStack_a6 < (short)local_188._14_2_);
          auVar44 = auVar44 | auVar43;
          if ((((((((((((((((auVar44 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar44 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar44 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar44 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar44 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar44 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar44 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar44 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar44 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar44 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar44 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar44 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar44[0xf] < '\0') {
            *(byte *)&ppVar22->flag = (byte)ppVar22->flag | 0x40;
            uVar58 = 0;
            iVar30 = 0;
            iVar21 = 0;
          }
          ppVar22->score = (int)(short)uVar58;
          ppVar22->end_query = iVar21;
          ppVar22->end_ref = iVar30;
          sStack_a4 = local_a8;
          sStack_a2 = sStack_a6;
          sStack_a0 = local_a8;
          sStack_9e = sStack_a6;
          sStack_9c = local_a8;
          sStack_9a = sStack_a6;
          local_98 = uVar17;
          local_78 = uVar18;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(local_238);
            return ppVar22;
          }
          return ppVar22;
        }
      }
      return (parasail_result_t *)0x0;
    }
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar25 = "_s1";
    }
    else {
      uVar24 = (ulong)(uint)_s1Len;
      if (0 < _s1Len) goto LAB_0055bb13;
      __format = "%s: %s must be > 0\n";
      pcVar25 = "_s1Len";
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_diag_sse2_128_16",pcVar25);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vJLimit = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            vWH = _mm_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi16(vJ, vNegOne),
                        _mm_cmplt_epi16(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi16(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi16(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi16(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}